

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

void flatbuffers::tests::UnicodeSurrogatesTest(void)

{
  bool expval;
  voffset_t field;
  uint8_t *buf;
  Table *this;
  String *this_00;
  char *expval_00;
  String *string;
  Table *root;
  IDLOptions local_a98;
  undefined1 local_788 [8];
  Parser parser;
  
  IDLOptions::IDLOptions(&local_a98);
  Parser::Parser((Parser *)local_788,&local_a98);
  IDLOptions::~IDLOptions(&local_a98);
  expval = Parser::Parse((Parser *)local_788,
                         "table T { F:string (id: 0); }root_type T;{ F:\"\\uD83D\\uDCA9\"}",
                         (char **)0x0,(char *)0x0);
  TestEq<bool,bool>(expval,true,
                    "\'parser.Parse(\"table T { F:string (id: 0); }\" \"root_type T;\" \"{ F:\\\"\\\\uD83D\\\\uDCA9\\\"}\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x31c,"");
  buf = FlatBufferBuilderImpl<false>::GetBufferPointer
                  ((FlatBufferBuilderImpl<false> *)((long)&parser.error_.field_2 + 8));
  this = GetRoot<flatbuffers::Table>(buf);
  field = FieldIndexToOffset(0);
  this_00 = Table::GetPointer<flatbuffers::String*,unsigned_int>(this,field);
  expval_00 = String::c_str(this_00);
  TestEqStr(expval_00,anon_var_dwarf_29acc5,"\'string->c_str()\' != \'\"\\xF0\\x9F\\x92\\xA9\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
            ,0x321,"");
  Parser::~Parser((Parser *)local_788);
  return;
}

Assistant:

void UnicodeSurrogatesTest() {
  flatbuffers::Parser parser;

  TEST_EQ(parser.Parse("table T { F:string (id: 0); }"
                       "root_type T;"
                       "{ F:\"\\uD83D\\uDCA9\"}"),
          true);
  auto root = flatbuffers::GetRoot<flatbuffers::Table>(
      parser.builder_.GetBufferPointer());
  auto string = root->GetPointer<flatbuffers::String *>(
      flatbuffers::FieldIndexToOffset(0));
  TEST_EQ_STR(string->c_str(), "\xF0\x9F\x92\xA9");
}